

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnLayer.cpp
# Opt level: O0

bool __thiscall tfs::DnnLayer::forward(DnnLayer *this)

{
  uint uVar1;
  DnnLayer *in_RDI;
  bool local_1;
  
  uVar1 = (*in_RDI->_vptr_DnnLayer[5])();
  if ((uVar1 & 1) == 0) {
    local_1 = false;
  }
  else if (in_RDI->m_next_layer == (DnnLayer *)0x0) {
    local_1 = true;
  }
  else {
    local_1 = forward(in_RDI);
  }
  return local_1;
}

Assistant:

bool
    DnnLayer::forward( void ) {
        // -----------------------------------------------------------------------------------
        // Forward propagate while training
        // -----------------------------------------------------------------------------------
        if( !runForward()) {
            return false;
        }
        if( m_next_layer != 0 ) {
            return m_next_layer->forward();
        }
        return true;
    }